

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlResimulate(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  int nChanges;
  Fra_Man_t *p_local;
  
  Fra_SmlAssignDist1(p->pSml,p->pPatWords);
  Fra_SmlSimulateOne(p->pSml);
  if ((p->pPars->fProve == 0) || (iVar1 = Fra_SmlCheckOutput(p), iVar1 == 0)) {
    aVar3 = Abc_Clock();
    iVar1 = Fra_ClassesRefine(p->pCla);
    iVar2 = Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
    clk._4_4_ = iVar2 + iVar1;
    if (p->pCla->vImps != (Vec_Int_t *)0x0) {
      iVar1 = Fra_ImpRefineUsingCex(p,p->pCla->vImps);
      clk._4_4_ = iVar1 + clk._4_4_;
    }
    if (p->vOneHots != (Vec_Int_t *)0x0) {
      iVar1 = Fra_OneHotRefineUsingCex(p,p->vOneHots);
      clk._4_4_ = iVar1 + clk._4_4_;
    }
    aVar4 = Abc_Clock();
    p->timeRef = (aVar4 - aVar3) + p->timeRef;
    if ((p->pPars->nFramesK == 0) && (clk._4_4_ < 1)) {
      printf("Error: A counter-example did not refine classes!\n");
    }
  }
  return;
}

Assistant:

void Fra_SmlResimulate( Fra_Man_t * p )
{
    int nChanges;
    abctime clk;
    Fra_SmlAssignDist1( p->pSml, p->pPatWords );
    Fra_SmlSimulateOne( p->pSml );
//    if ( p->pPars->fPatScores )
//        Fra_CleanPatScores( p );
    if ( p->pPars->fProve && Fra_SmlCheckOutput(p) )
        return;
clk = Abc_Clock();
    nChanges = Fra_ClassesRefine( p->pCla );
    nChanges += Fra_ClassesRefine1( p->pCla, 1, NULL );
    if ( p->pCla->vImps )
        nChanges += Fra_ImpRefineUsingCex( p, p->pCla->vImps );
    if ( p->vOneHots )
        nChanges += Fra_OneHotRefineUsingCex( p, p->vOneHots );
p->timeRef += Abc_Clock() - clk;
    if ( !p->pPars->nFramesK && nChanges < 1 )
        printf( "Error: A counter-example did not refine classes!\n" );
//    assert( nChanges >= 1 );
//printf( "Refined classes = %5d.   Changes = %4d.\n", Vec_PtrSize(p->vClasses), nChanges );
}